

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

Time __thiscall
helics::CommonCore::timeRequest(CommonCore *this,LocalFederateId federateID,Time next)

{
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  bool bVar1;
  FederateStates FVar2;
  int iVar3;
  undefined8 uVar4;
  string *psVar5;
  baseType in_RDX;
  iteration_time iVar6;
  iteration_time ret;
  ActionMessage treq;
  ActionMessage terminate;
  BrokerState cBrokerState;
  FederateState *fed;
  undefined1 in_stack_0000063e;
  IterationRequest in_stack_0000063f;
  FederateState *in_stack_00000640;
  Time in_stack_00000648;
  ActionMessage *in_stack_fffffffffffffd48;
  FederateState *in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 uVar7;
  action_t in_stack_fffffffffffffd6c;
  undefined4 uVar8;
  ActionMessage *in_stack_fffffffffffffd70;
  CommonCore *in_stack_fffffffffffffd88;
  ActionMessage *M;
  LocalFederateId in_stack_fffffffffffffd94;
  ActionMessage local_1e0;
  BaseType local_118;
  BaseType local_114;
  BaseType local_108;
  BaseType local_100;
  BrokerState local_52;
  FederateState *local_28;
  baseType local_18;
  baseType local_8;
  
  local_18 = in_RDX;
  local_28 = getFederateAt(in_stack_fffffffffffffd88,in_stack_fffffffffffffd94);
  if (local_28 == (FederateState *)0x0) {
    uVar4 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    message._M_len._4_4_ = in_stack_fffffffffffffd6c;
    message._M_len._0_4_ = in_stack_fffffffffffffd68;
    message._M_str = (char *)in_stack_fffffffffffffd70;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_stack_fffffffffffffd60,message);
    __cxa_throw(uVar4,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  bVar1 = FederateState::isCallbackFederate(local_28);
  if (bVar1) {
    uVar4 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    message_00._M_len._4_4_ = in_stack_fffffffffffffd6c;
    message_00._M_len._0_4_ = in_stack_fffffffffffffd68;
    message_00._M_str = (char *)in_stack_fffffffffffffd70;
    InvalidFunctionCall::InvalidFunctionCall
              ((InvalidFunctionCall *)in_stack_fffffffffffffd60,message_00);
    __cxa_throw(uVar4,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  }
  local_52 = BrokerBase::getBrokerState((BrokerBase *)0x524c33);
  if ((ushort)(local_52 + CONNECTED) < 5) {
    ActionMessage::ActionMessage(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    local_114 = (BaseType)
                std::atomic::operator_cast_to_GlobalFederateId
                          ((atomic<helics::GlobalFederateId> *)in_stack_fffffffffffffd48);
    local_100 = local_114;
    local_118 = (BaseType)
                std::atomic::operator_cast_to_GlobalFederateId
                          ((atomic<helics::GlobalFederateId> *)in_stack_fffffffffffffd48);
    local_108 = local_118;
    FederateState::addAction(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffd50);
  }
  FVar2 = FederateState::getState((FederateState *)0x524d0d);
  if (FVar2 == EXECUTING) {
    M = &local_1e0;
    ActionMessage::ActionMessage(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    local_1e0.source_id = std::atomic<helics::GlobalFederateId>::load(&local_28->global_id,seq_cst);
    local_1e0.dest_id = std::atomic<helics::GlobalFederateId>::load(&local_28->global_id,seq_cst);
    local_1e0.actionTime.internalTimeCode = local_18;
    setActionFlag<helics::ActionMessage,helics::GeneralFlags>(M,indicator_flag);
    BrokerBase::addActionMessage((BrokerBase *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    iVar6 = FederateState::requestTime
                      (in_stack_00000640,in_stack_00000648,in_stack_0000063f,(bool)in_stack_0000063e
                      );
    local_8 = (baseType)iVar6.grantedTime.internalTimeCode;
    if (iVar6.state == HALTED) {
      local_8 = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
    }
    else if (iVar6.state == ERROR_RESULT) {
      iVar3 = FederateState::lastErrorCode(local_28);
      if (iVar3 != -1) {
        uVar4 = __cxa_allocate_exception(0x28);
        psVar5 = FederateState::lastErrorString_abi_cxx11_(local_28);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd50);
        message_02._M_len._4_4_ = in_stack_fffffffffffffd6c;
        message_02._M_len._0_4_ = in_stack_fffffffffffffd68;
        message_02._M_str = (char *)in_stack_fffffffffffffd70;
        FunctionExecutionFailure::FunctionExecutionFailure
                  ((FunctionExecutionFailure *)psVar5,message_02);
        __cxa_throw(uVar4,&FunctionExecutionFailure::typeinfo,
                    FunctionExecutionFailure::~FunctionExecutionFailure);
      }
      uVar4 = __cxa_allocate_exception(0x28);
      uVar7 = (undefined4)uVar4;
      uVar8 = (undefined4)((ulong)uVar4 >> 0x20);
      psVar5 = FederateState::lastErrorString_abi_cxx11_(local_28);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd50);
      message_01._M_len._4_4_ = uVar8;
      message_01._M_len._0_4_ = uVar7;
      message_01._M_str = (char *)psVar5;
      RegistrationFailure::RegistrationFailure
                ((RegistrationFailure *)in_stack_fffffffffffffd60,message_01);
      __cxa_throw(CONCAT44(uVar8,uVar7),&RegistrationFailure::typeinfo,
                  RegistrationFailure::~RegistrationFailure);
    }
    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffd50);
  }
  else {
    if (FVar2 != FINISHED) {
      uVar4 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      message_03._M_len._4_4_ = in_stack_fffffffffffffd6c;
      message_03._M_len._0_4_ = in_stack_fffffffffffffd68;
      message_03._M_str = (char *)in_stack_fffffffffffffd70;
      InvalidFunctionCall::InvalidFunctionCall
                ((InvalidFunctionCall *)in_stack_fffffffffffffd60,message_03);
      __cxa_throw(uVar4,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
    }
    local_8 = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
  }
  return (Time)local_8;
}

Assistant:

Time CommonCore::timeRequest(LocalFederateId federateID, Time next)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid timeRequest"));
    }
    if (fed->isCallbackFederate()) {
        throw(InvalidFunctionCall(
            "Time request operation is not permitted for callback based federates"));
    }
    auto cBrokerState = getBrokerState();
    switch (cBrokerState) {
        case BrokerState::TERMINATING:
        case BrokerState::TERMINATED:
        case BrokerState::TERMINATING_ERROR:
        case BrokerState::CONNECTED_ERROR:
        case BrokerState::ERRORED: {
            ActionMessage terminate(CMD_STOP);
            terminate.dest_id = fed->global_id;
            terminate.source_id = fed->global_id;
            fed->addAction(terminate);
        } break;
        default:
            break;
    }
    switch (fed->getState()) {
        case FederateStates::EXECUTING: {
            // generate the request through the core
            ActionMessage treq(CMD_TIME_REQUEST);
            treq.source_id = fed->global_id.load();
            treq.dest_id = fed->global_id.load();
            treq.actionTime = next;
            setActionFlag(treq, indicator_flag);
            addActionMessage(treq);
            auto ret = fed->requestTime(next, IterationRequest::NO_ITERATIONS, false);

            switch (ret.state) {
                case IterationResult::ERROR_RESULT:
                    switch (fed->lastErrorCode()) {
                        case HELICS_ERROR_REGISTRATION_FAILURE:
                            throw(RegistrationFailure(fed->lastErrorString()));
                        default:
                            throw(FunctionExecutionFailure(fed->lastErrorString()));
                    }

                case IterationResult::HALTED:
                    return Time::maxVal();
                default:
                    return ret.grantedTime;
            }
        }
        case FederateStates::FINISHED:
            return Time::maxVal();
        default:
            throw(InvalidFunctionCall("time request should only be called in execution state"));
    }
}